

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall ncnn::Gemm::load_param(Gemm *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  int local_4;
  
  fVar2 = ParamDict::get(in_RSI,0,1.0);
  *(float *)(in_RDI + 0xd0) = fVar2;
  fVar2 = ParamDict::get(in_RSI,1,1.0);
  *(float *)(in_RDI + 0xd4) = fVar2;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0xe0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,5,0);
  *(int *)(in_RDI + 0xe4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,6,0);
  *(int *)(in_RDI + 0xe8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,7,0);
  *(int *)(in_RDI + 0xec) = iVar1;
  iVar1 = ParamDict::get(in_RSI,8,0);
  *(int *)(in_RDI + 0xf0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,9,0);
  *(int *)(in_RDI + 0xf4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,10,0);
  *(int *)(in_RDI + 0xf8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xb,0);
  *(int *)(in_RDI + 0xfc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xc,0);
  *(int *)(in_RDI + 0x100) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xd,0);
  *(int *)(in_RDI + 0x104) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xe,0);
  *(int *)(in_RDI + 0x108) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0x14,0);
  *(int *)(in_RDI + 0x10c) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0x15,0);
  *(int *)(in_RDI + 0x110) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0x16,0);
  *(int *)(in_RDI + 0x114) = iVar1;
  if ((*(int *)(in_RDI + 0xe0) == 1) &&
     ((*(int *)(in_RDI + 0xec) == 0 || (*(int *)(in_RDI + 0xf4) == 0)))) {
    fprintf(_stderr,"constantM and constantK must be non-zero when constantA enabled");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else if ((*(int *)(in_RDI + 0xe4) == 1) &&
          ((*(int *)(in_RDI + 0xf0) == 0 || (*(int *)(in_RDI + 0xf4) == 0)))) {
    fprintf(_stderr,"constantN and constantK must be non-zero when constantB enabled");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else if ((*(int *)(in_RDI + 0xe8) == 1) &&
          ((*(int *)(in_RDI + 0xf8) < -1 || (4 < *(int *)(in_RDI + 0xf8))))) {
    fprintf(_stderr,"constant_broadcast_type_C must be -1 or 0~4 when constantC enabled");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    if ((*(int *)(in_RDI + 0xe0) == 0) &&
       ((*(int *)(in_RDI + 0xe4) == 1 && (*(int *)(in_RDI + 0xe8) == 1)))) {
      *(undefined1 *)(in_RDI + 8) = 1;
    }
    if (((*(int *)(in_RDI + 0xe0) == 1) && (*(int *)(in_RDI + 0xe4) == 0)) &&
       (*(int *)(in_RDI + 0xe8) == 1)) {
      *(undefined1 *)(in_RDI + 8) = 1;
    }
    if (((*(int *)(in_RDI + 0xe0) == 1) && (*(int *)(in_RDI + 0xe4) == 1)) &&
       (*(int *)(in_RDI + 0xe8) == 0)) {
      *(undefined1 *)(in_RDI + 8) = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Gemm::load_param(const ParamDict& pd)
{
    alpha = pd.get(0, 1.f);
    beta = pd.get(1, 1.f);
    transA = pd.get(2, 0);
    transB = pd.get(3, 0);
    constantA = pd.get(4, 0);
    constantB = pd.get(5, 0);
    constantC = pd.get(6, 0);
    constantM = pd.get(7, 0);
    constantN = pd.get(8, 0);
    constantK = pd.get(9, 0);
    constant_broadcast_type_C = pd.get(10, 0);
    output_N1M = pd.get(11, 0);
    output_elempack = pd.get(12, 0);
    output_elemtype = pd.get(13, 0);
    output_transpose = pd.get(14, 0);
    constant_TILE_M = pd.get(20, 0);
    constant_TILE_N = pd.get(21, 0);
    constant_TILE_K = pd.get(22, 0);

    if (constantA == 1 && (constantM == 0 || constantK == 0))
    {
        NCNN_LOGE("constantM and constantK must be non-zero when constantA enabled");
        return -1;
    }

    if (constantB == 1 && (constantN == 0 || constantK == 0))
    {
        NCNN_LOGE("constantN and constantK must be non-zero when constantB enabled");
        return -1;
    }

    if (constantC == 1 && (constant_broadcast_type_C < -1 || constant_broadcast_type_C > 4))
    {
        NCNN_LOGE("constant_broadcast_type_C must be -1 or 0~4 when constantC enabled");
        return -1;
    }

    if (constantA == 0 && constantB == 1 && constantC == 1)
        one_blob_only = true;

    if (constantA == 1 && constantB == 0 && constantC == 1)
        one_blob_only = true;

    if (constantA == 1 && constantB == 1 && constantC == 0)
        one_blob_only = true;

    return 0;
}